

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ConfidentialTxInReference * __thiscall
cfd::ConfidentialTransactionController::AddTxIn
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,Pubkey *pubkey,
          uint32_t sequence)

{
  uint32_t index_00;
  ScriptBuilder *this_00;
  uint32_t in_ECX;
  Txid *in_RDX;
  long in_RSI;
  ConfidentialTxInReference *in_RDI;
  Pubkey *in_R8;
  uint32_t in_R9D;
  uint32_t index;
  undefined4 in_stack_ffffffffffffff20;
  ScriptBuilder local_88;
  Script local_68;
  uint32_t local_30;
  Pubkey *local_28;
  
  local_28 = in_R8;
  core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x556cbb);
  this_00 = core::ScriptBuilder::AppendData(&local_88,local_28);
  core::ScriptBuilder::Build(&local_68,this_00);
  index_00 = core::ConfidentialTransaction::AddTxIn
                       ((ConfidentialTransaction *)(in_RSI + 0x10),in_RDX,in_ECX,in_R9D,&local_68);
  core::Script::~Script((Script *)CONCAT44(index_00,in_stack_ffffffffffffff20));
  core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x556d24);
  local_30 = index_00;
  core::ConfidentialTransaction::GetTxIn(in_RDI,(ConfidentialTransaction *)(in_RSI + 0x10),index_00)
  ;
  return in_RDI;
}

Assistant:

const ConfidentialTxInReference ConfidentialTransactionController::AddTxIn(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey, uint32_t sequence) {
  uint32_t index = transaction_.AddTxIn(
      txid, vout, sequence, ScriptBuilder().AppendData(pubkey).Build());
  return transaction_.GetTxIn(index);
}